

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O0

void __thiscall OpenMD::Mie::calcForce(Mie *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  reference this_00;
  reference pvVar5;
  double *pdVar6;
  int *in_RSI;
  int *in_RDI;
  Vector<double,_3U> *pVVar7;
  RealType dudr;
  RealType pot_temp;
  RealType myDerivC;
  RealType myDeriv;
  RealType myPotC;
  RealType myPot;
  RealType rcos;
  RealType ros;
  RealType nmScale;
  int mAtt;
  int nRep;
  RealType epsilon;
  RealType sigmai;
  MieInteractionData *mixer;
  Mie *in_stack_00000160;
  Vector<double,_3U> *in_stack_ffffffffffffff18;
  Vector<double,_3U> *in_stack_ffffffffffffff20;
  Vector<double,_3U> *in_stack_ffffffffffffff28;
  RealType *in_stack_ffffffffffffff38;
  Vector<double,_3U> *pVVar8;
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  *this_01;
  RealType *in_stack_ffffffffffffff58;
  Mie *in_stack_ffffffffffffff60;
  double local_58;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    initialize(in_stack_00000160);
  }
  this_01 = (vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
             *)(in_RDI + 0x16);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)*in_RSI);
  this_00 = std::
            vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
            ::operator[](this_01,(long)*pvVar4);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)in_RSI[1]);
  pvVar5 = std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::
           operator[](this_00,(long)*pvVar4);
  dVar1 = pvVar5->sigmai;
  dVar2 = pvVar5->epsilon;
  dVar3 = pvVar5->nmScale;
  local_58 = 0.0;
  getMieFunc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI,(int *)this_00,
             (RealType *)this_01,in_stack_ffffffffffffff38);
  if ((*(byte *)(in_RSI + 0xe) & 1) == 0) {
    if ((*(byte *)((long)in_RSI + 0x39) & 1) == 0) {
      local_58 = 0.0;
    }
    else {
      getMieFunc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI,(int *)this_00,
                 (RealType *)this_01,in_stack_ffffffffffffff38);
      local_58 = (*(double *)(in_RSI + 8) - *(double *)(in_RSI + 0xc)) * 0.0 * dVar1 + 0.0;
    }
  }
  else {
    getMieFunc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI,(int *)this_00,
               (RealType *)this_01,in_stack_ffffffffffffff38);
  }
  pVVar7 = (Vector<double,_3U> *)(*(double *)(in_RSI + 0x14) * dVar3 * dVar2 * (0.0 - local_58));
  *(double *)(in_RSI + 0x34) = (double)pVVar7 + *(double *)(in_RSI + 0x34);
  dVar1 = *(double *)(in_RSI + 0x10);
  pVVar8 = pVVar7;
  pdVar6 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),1);
  *pdVar6 = dVar1 * (double)pVVar8 + *pdVar6;
  if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
    in_stack_ffffffffffffff20 = *(Vector<double,_3U> **)(in_RSI + 0x10);
    pdVar6 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),1);
    *pdVar6 = (double)in_stack_ffffffffffffff20 * (double)pVVar7 + *pdVar6;
    in_stack_ffffffffffffff28 = pVVar7;
  }
  OpenMD::operator*(in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
  operator/(in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
  Vector<double,_3U>::operator+=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return;
}

Assistant:

void Mie::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MieInteractionData& mixer =
        MixingMap[MieTids[idat.atid1]][MieTids[idat.atid2]];
    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;
    int nRep         = mixer.nRep;
    int mAtt         = mixer.mAtt;
    RealType nmScale = mixer.nmScale;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getMieFunc(ros, nRep, mAtt, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getMieFunc(rcos, nRep, mAtt, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getMieFunc(rcos, nRep, mAtt, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * nmScale * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * nmScale * epsilon *
                    (myDeriv - myDerivC) * sigmai;

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }